

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedForward.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__src;
  char **ppcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  undefined **message;
  undefined7 uVar13;
  size_t __n;
  long lVar14;
  char *pcVar15;
  stat fs2;
  char self_path [4096];
  char exe [4096];
  char build_path_real [4096];
  char self_path_real [4096];
  stat local_40c8;
  char local_4038 [4096];
  stat local_3038 [28];
  char *local_2038;
  stat *psStack_2030;
  undefined8 local_2028;
  char local_1038 [4104];
  
  pcVar6 = *argv;
  cVar10 = *pcVar6;
  if (cVar10 == '\0') {
LAB_00101380:
    pcVar4 = getenv("PATH");
    if (pcVar4 == (char *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = strlen(pcVar4);
    }
    pcVar12 = pcVar4;
    do {
      pcVar11 = pcVar12;
      if (pcVar11 == pcVar4 + sVar7) goto LAB_00101468;
      __src = pcVar11 + -1;
      do {
        pcVar15 = __src;
        __src = pcVar15 + 1;
      } while (pcVar15[1] == ':');
      for (__n = 0; (__src[__n] != '\0' && (__src[__n] != ':')); __n = __n + 1) {
      }
      pcVar12 = __src + __n;
      bVar2 = true;
      if (__src < pcVar12) {
        if ((pcVar15[__n] == '/') || (pcVar15[__n] == '\\')) {
          __n = __n - 1;
        }
        strncpy(local_4038,__src,__n);
        local_4038[__n] = '/';
        strcpy(local_4038 + __n + 1,pcVar6);
        iVar3 = access(local_4038,1);
        if (iVar3 == 0) {
          local_4038[__n] = '\0';
          bVar2 = false;
          pcVar12 = __src;
        }
      }
    } while (bVar2);
    if (pcVar11 == pcVar4 + sVar7) {
LAB_00101468:
      main_cold_2();
      return 1;
    }
  }
  else {
    bVar2 = false;
    pcVar4 = pcVar6;
    do {
      pcVar4 = pcVar4 + 1;
      if ((cVar10 == '\\') || (cVar10 == '/')) {
        bVar2 = true;
      }
      cVar10 = *pcVar4;
    } while ((cVar10 != '\0') && (!bVar2));
    if (!bVar2) goto LAB_00101380;
    uVar5 = strlen(pcVar6);
    if ((long)uVar5 < 0) {
      cVar10 = '\x01';
      uVar8 = 0xffffffff;
    }
    else {
      uVar9 = 0xffffffff;
      pcVar4 = pcVar6 + uVar5;
      do {
        if ((*pcVar4 == '\\') || (*pcVar4 == '/')) {
          uVar9 = uVar5 & 0xffffffff;
        }
        uVar8 = (uint)uVar9;
        cVar10 = (char)(uVar9 >> 0x1f);
      } while ((pcVar6 <= pcVar4 + -1) &&
              (uVar5 = (ulong)((int)uVar5 - 1), pcVar4 = pcVar4 + -1, (int)uVar8 < 0));
    }
    if (cVar10 == '\0') {
      if (uVar8 == 0) {
        local_4038[0] = '/';
        local_4038[1] = '\0';
      }
      else {
        strncpy(local_4038,pcVar6,(ulong)uVar8);
        local_4038[uVar8] = '\0';
      }
    }
    else {
      local_4038[0] = '.';
      local_4038[1] = '\0';
    }
  }
  pcVar6 = realpath(local_4038,local_1038);
  if (pcVar6 == (char *)0x0) {
    message = (undefined **)local_3038;
    kwsys_shared_forward_strerror((char *)message);
    fprintf(_stderr,"Error converting self path \"%s\" to real path: %s\n",local_4038,message);
LAB_00101720:
    bVar2 = true;
    goto LAB_00101723;
  }
  pcVar6 = realpath("/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/build_O1/Source/kwsys"
                    ,(char *)&local_2038);
  if (((((pcVar6 == (char *)0x0) || (iVar3 = stat(local_1038,local_3038), iVar3 != 0)) ||
       (iVar3 = stat((char *)&local_2038,&local_40c8), iVar3 != 0)) ||
      ((local_40c8.st_dev != local_3038[0].st_dev || (local_40c8.st_ino != local_3038[0].st_ino))))
     || (local_40c8.st_size != local_3038[0].st_size)) {
    message = (undefined **)&kwsys_shared_forward_get_settings_search_path_install;
  }
  else {
    message = &kwsys_shared_forward_get_settings_search_path_build;
  }
  pcVar6 = (char *)((stat *)message)->st_dev;
  if (pcVar6 != (char *)0x0) {
    lVar14 = 0;
    do {
      if (lVar14 != 0) {
        sVar7 = strlen(kwsys_shared_forward_ldpath);
        (kwsys_shared_forward_ldpath + sVar7)[0] = ':';
        (kwsys_shared_forward_ldpath + sVar7)[1] = '\0';
      }
      sVar7 = strlen(kwsys_shared_forward_ldpath);
      iVar3 = kwsys_shared_forward_fullpath
                        (local_4038,pcVar6,kwsys_shared_forward_ldpath + sVar7,"runtime path entry")
      ;
      if (iVar3 == 0) goto LAB_00101720;
      pcVar6 = *(char **)((long)((stat *)message)->__unused + lVar14 + -0x70);
      lVar14 = lVar14 + 8;
    } while (pcVar6 != (char *)0x0);
  }
  iVar3 = kwsys_shared_forward_fullpath
                    (local_4038,"cmsysTestProcess",(char *)local_3038,"executable file");
  bVar2 = true;
  if (iVar3 == 0) goto LAB_00101723;
  pcVar6 = getenv("LD_LIBRARY_PATH");
  if (pcVar6 != (char *)0x0) {
    sVar7 = strlen(kwsys_shared_forward_ldpath);
    (kwsys_shared_forward_ldpath + sVar7)[0] = ':';
    (kwsys_shared_forward_ldpath + sVar7)[1] = '\0';
    strcat(kwsys_shared_forward_ldpath,pcVar6);
  }
  putenv(kwsys_shared_forward_ldpath);
  if (argc < 2) {
    message = (undefined **)0x0;
LAB_0010168c:
    if ((char)message != '\0') {
      pcVar6 = argv[1];
      iVar3 = strcmp(pcVar6,"--print");
      if (iVar3 == 0) {
        message = (undefined **)0x0;
        fprintf(_stdout,"%s\n",kwsys_shared_forward_ldpath);
        fprintf(_stdout,"%s\n",local_3038);
        goto LAB_001016e9;
      }
      if (((char)message != '\0') && (iVar3 = strcmp(pcVar6,"--ldd"), iVar3 == 0)) {
        local_2038 = "ldd";
        local_2028 = 0;
        psStack_2030 = local_3038;
        execvp("ldd",&local_2038);
        kwsys_shared_forward_print_failure(&local_2038);
        goto LAB_001017af;
      }
    }
    *argv = (char *)local_3038;
    execvp((char *)local_3038,argv);
    kwsys_shared_forward_print_failure(argv);
  }
  else {
    iVar3 = strcmp(argv[1],"--command");
    uVar13 = (undefined7)((ulong)message >> 8);
    message = (undefined **)CONCAT71(uVar13,1);
    if (iVar3 != 0) goto LAB_0010168c;
    if (argc != 2) {
      ppcVar1 = argv + 2;
      argv = argv + 2;
      strcpy((char *)local_3038,*ppcVar1);
      message = (undefined **)CONCAT71(uVar13,3 < argc);
      goto LAB_0010168c;
    }
    main_cold_1();
LAB_001017af:
    message = (undefined **)0x1;
LAB_001016e9:
    bVar2 = false;
  }
LAB_00101723:
  if (bVar2) {
    return 1;
  }
  return (int)message;
}

Assistant:

int main(int argc, char** argv)
{
  return cmsys_shared_forward_to_real(argc, argv);
}